

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O1

IXML_Attr * ixmlElement_getAttributeNodeNS(IXML_Element *element,char *namespaceURI,char *localName)

{
  int iVar1;
  IXML_Attr *pIVar2;
  
  if (localName == (char *)0x0 || (namespaceURI == (char *)0x0 || element == (IXML_Element *)0x0)) {
    pIVar2 = (IXML_Attr *)0x0;
  }
  else {
    pIVar2 = (IXML_Attr *)(element->n).firstAttr;
    while ((pIVar2 != (IXML_Attr *)0x0 &&
           ((iVar1 = strcmp((pIVar2->n).localName,localName), iVar1 != 0 ||
            (iVar1 = strcmp((pIVar2->n).namespaceURI,namespaceURI), iVar1 != 0))))) {
      pIVar2 = (IXML_Attr *)(pIVar2->n).nextSibling;
    }
  }
  return pIVar2;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNodeNS(IXML_Element *element,
	const DOMString namespaceURI,
	const DOMString localName)
{
	IXML_Node *attrNode = NULL;

	if (element == NULL || namespaceURI == NULL || localName == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, localName) == 0 &&
			strcmp(attrNode->namespaceURI, namespaceURI) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}